

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O2

void __thiscall Assimp::LWO::Layer::Layer(Layer *this,Layer *param_1)

{
  uint16_t uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  (this->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mTempPoints).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mTempPoints).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mTempPoints).
       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mTempPoints).super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mPointReferrers).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->mWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mSWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mSWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mSWeightChannels).
       super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_1->mSWeightChannels).
  super__Vector_base<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (param_1->mVColorChannels).
       super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (param_1->mVColorChannels).
       super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->mVColorChannels).
       super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mVColorChannels).
  super__Vector_base<Assimp::LWO::VColorChannel,_std::allocator<Assimp::LWO::VColorChannel>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mUVChannels).
       super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mUVChannels).
       super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mUVChannels).
       super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_1->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mUVChannels).
  super__Vector_base<Assimp::LWO::UVChannel,_std::allocator<Assimp::LWO::UVChannel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  NormalChannel::NormalChannel(&this->mNormals,&param_1->mNormals);
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  (this->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->mFaces).super__Vector_base<Assimp::LWO::Face,_std::allocator<Assimp::LWO::Face>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar1 = param_1->mIndex;
  this->mParent = param_1->mParent;
  this->mIndex = uVar1;
  uVar2 = param_1->mPointIDXOfs;
  this->mFaceIDXOfs = param_1->mFaceIDXOfs;
  this->mPointIDXOfs = uVar2;
  std::__cxx11::string::string((string *)&this->mName,(string *)&param_1->mName);
  fVar3 = (param_1->mPivot).x;
  fVar4 = (param_1->mPivot).y;
  *(undefined8 *)((long)&(this->mPivot).y + 1) = *(undefined8 *)((long)&(param_1->mPivot).y + 1);
  (this->mPivot).x = fVar3;
  (this->mPivot).y = fVar4;
  return;
}

Assistant:

Layer()
        : mFaceIDXOfs   (0)
        , mPointIDXOfs  (0)
        , mParent       (0x0)
        , mIndex        (0xffff)
        , skip          (false)
    {}